

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::Error(TestResponseProxy *this,int line,char *file,string *message)

{
  Log *this_00;
  char *pcVar1;
  string *message_local;
  char *file_local;
  int line_local;
  TestResponseProxy *this_local;
  
  this_00 = this->pLogger;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  gnilk::Log::Error<char_const*,char_const*,int,char_const*>
            (this_00,"%s:%d\t\'%s\'",file,line,pcVar1);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (message);
  printf("*** GENERAL ERROR: %s:%d\t\'%s\'\n",file,(ulong)(uint)line,pcVar1);
  this->errorCount = this->errorCount + 1;
  if (this->testResult == kTestResult_Pass) {
    this->testResult = kTestResult_TestFail;
  }
  TerminateThreadIfNeeded(this);
  return;
}

Assistant:

void TestResponseProxy::Error(int line, const char *file, std::string message) {
    pLogger->Error("%s:%d\t'%s'", file, line, message.c_str());

    printf("*** GENERAL ERROR: %s:%d\t'%s'\n", file, line, message.c_str());
    this->errorCount++;
    if (testResult < kTestResult_TestFail) {
        testResult = kTestResult_TestFail;
    }
    TerminateThreadIfNeeded();
}